

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::define(Options *this,string *aDefinition,string *aDescription)

{
  int iVar1;
  reference ppOVar2;
  int index;
  string *aDescription_local;
  string *aDefinition_local;
  Options *this_local;
  
  iVar1 = define(this,aDefinition);
  ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::operator[]
                      (&this->m_optionRegister,(long)iVar1);
  Option_register::setDescription(*ppOVar2,aDescription);
  return iVar1;
}

Assistant:

int Options::define(const std::string& aDefinition,
		const std::string& aDescription) {
   int index = define(aDefinition);
   m_optionRegister[index]->setDescription(aDescription);
   return index;
}